

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::
DoSimdIsTrue<wabt::interp::Simd<unsigned_char,(unsigned_char)16>,(unsigned_char)1>(Thread *this)

{
  difference_type dVar1;
  Simd<unsigned_char,_(unsigned_char)__x10_> val;
  uchar local_18 [16];
  
  local_18 = (uchar  [16])Pop<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this);
  dVar1 = std::
          __count_if<unsigned_char*,__gnu_cxx::__ops::_Iter_pred<wabt::interp::Thread::DoSimdIsTrue<wabt::interp::Simd<unsigned_char,(unsigned_char)16>,(unsigned_char)1>()::_lambda(unsigned_char)_1_>>
                    (local_18);
  Push<bool>(this,0 < dVar1);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdIsTrue() {
  using L = typename S::LaneType;
  auto val = Pop<S>();
  Push(std::count_if(std::begin(val.v), std::end(val.v),
                     [](L x) { return x != 0; }) >= count);
  return RunResult::Ok;
}